

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::EnforceCommentStyle::fodder(EnforceCommentStyle *this,Fodder *fodder)

{
  pointer pFVar1;
  string *s;
  FodderElement *f;
  pointer pFVar2;
  
  pFVar1 = (fodder->
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pFVar2 = (fodder->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_start; pFVar2 != pFVar1; pFVar2 = pFVar2 + 1) {
    if (((pFVar2->kind & ~PARAGRAPH) == LINE_END) &&
       (s = (pFVar2->comment).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start,
       (long)(pFVar2->comment).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)s == 0x20)) {
      fixComment(this,s,(bool)(this->super_FmtPass).field_0x24);
    }
    (this->super_FmtPass).field_0x24 = 0;
  }
  return;
}

Assistant:

void fodder(Fodder &fodder)
    {
        for (auto &f : fodder) {
            switch (f.kind) {
                case FodderElement::LINE_END:
                case FodderElement::PARAGRAPH:
                    if (f.comment.size() == 1) {
                        fixComment(f.comment[0], firstFodder);
                    }
                    break;

                case FodderElement::INTERSTITIAL: break;
            }
            firstFodder = false;
        }
    }